

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O0

Aig_Tsi_t * Aig_TsiStart(Aig_Man_t *pAig)

{
  int iVar1;
  Aig_Tsi_t *__s;
  Vec_Ptr_t *pVVar2;
  Aig_MmFixed_t *pAVar3;
  uint **ppuVar4;
  Aig_Tsi_t *p;
  Aig_Man_t *pAig_local;
  
  __s = (Aig_Tsi_t *)malloc(0x30);
  memset(__s,0,0x30);
  __s->pAig = pAig;
  iVar1 = Aig_ManRegNum(pAig);
  iVar1 = Abc_BitWordNum(iVar1 << 1);
  __s->nWords = iVar1;
  pVVar2 = Vec_PtrAlloc(1000);
  __s->vStates = pVVar2;
  pAVar3 = Aig_MmFixedStart(__s->nWords * 4 + 8,10000);
  __s->pMem = pAVar3;
  iVar1 = Abc_PrimeCudd(500);
  __s->nBins = iVar1;
  ppuVar4 = (uint **)malloc((long)__s->nBins << 3);
  __s->pBins = ppuVar4;
  memset(__s->pBins,0,(long)__s->nBins << 3);
  return __s;
}

Assistant:

Aig_Tsi_t * Aig_TsiStart( Aig_Man_t * pAig )
{
    Aig_Tsi_t * p;
    p = ABC_ALLOC( Aig_Tsi_t, 1 );
    memset( p, 0, sizeof(Aig_Tsi_t) );
    p->pAig    = pAig;
    p->nWords  = Abc_BitWordNum( 2*Aig_ManRegNum(pAig) );
    p->vStates = Vec_PtrAlloc( 1000 );
    p->pMem    = Aig_MmFixedStart( sizeof(unsigned) * p->nWords + sizeof(unsigned *), 10000 );
    p->nBins   = Abc_PrimeCudd(TSI_MAX_ROUNDS/2);
    p->pBins   = ABC_ALLOC( unsigned *, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned *) * p->nBins );
    return p;
}